

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

int __thiscall helics::BrokerBase::parseArgs(BrokerBase *this,string_view initializationString)

{
  element_type *this_00;
  ConfigType CVar1;
  ParseOutput PVar2;
  shared_ptr<helics::helicsCLI11App> sVar3;
  string_view initializationString_local;
  allocator<char> local_69;
  string local_68;
  shared_ptr<helics::helicsCLI11App> app;
  shared_ptr<helics::helicsCLI11App> sApp;
  __shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  initializationString_local._M_str = initializationString._M_str;
  initializationString_local._M_len = initializationString._M_len;
  CVar1 = fileops::getConfigType((string_view)initializationString);
  switch(CVar1) {
  case JSON_STRING:
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&initializationString_local,(allocator<char> *)&app);
    loadInfoFromJson(this,&local_68,true);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->configString,&initializationString_local);
    return 0;
  case JSON_FILE:
    this->fileInUse = true;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&initializationString_local,(allocator<char> *)&app);
    loadInfoFromJson(this,&local_68,true);
    break;
  case TOML_STRING:
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&initializationString_local,(allocator<char> *)&app);
    loadInfoFromToml(this,&local_68,true);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->configString,&initializationString_local);
    return 0;
  case TOML_FILE:
    this->fileInUse = true;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&initializationString_local,(allocator<char> *)&app);
    loadInfoFromToml(this,&local_68,true);
    break;
  default:
    sVar3 = generateBaseCLI((BrokerBase *)&app);
    (*this->_vptr_BrokerBase[8])
              (&sApp,this,
               sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    this_00 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<helics::helicsCLI11App,void>
              (local_28,&sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>
              );
    CLI::App::add_subcommand(&this_00->super_App,(App_p *)local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&initializationString_local,&local_69);
    PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>
                      (app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return PVar2;
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->configString,&initializationString_local);
  return 0;
}

Assistant:

int BrokerBase::parseArgs(std::string_view initializationString)
{
    auto type = fileops::getConfigType(initializationString);

    switch (type) {
        case fileops::ConfigType::JSON_FILE:
            fileInUse = true;
            loadInfoFromJson(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::JSON_STRING:
            try {
                loadInfoFromJson(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeConfigToml(initializationString)) {
                    try {
                        loadInfoFromToml(std::string(initializationString));
                        configString = initializationString;
                        return 0;
                    }
                    catch (const helics::InvalidParameter&) {
                        if (fileops::looksLikeCommandLine(initializationString)) {
                            break;
                        }
                        throw;
                    }
                }
                throw;
            }
            break;
        case fileops::ConfigType::TOML_FILE:
            fileInUse = true;
            loadInfoFromToml(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::TOML_STRING:
            try {
                loadInfoFromToml(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeCommandLine(configString)) {
                    break;
                }
                throw;
            }
            break;
        case fileops::ConfigType::CMD_LINE:
        case fileops::ConfigType::NONE:
            // with NONE there are default command line and environment possibilities
            break;
    }

    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(std::string(initializationString));
    return static_cast<int>(res);
}